

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::delinearize_metrics_dim<3>(Omega_h *this,Reals *lms)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_c0;
  undefined1 local_b0 [8];
  type f;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  Write<double> out;
  int n;
  Reals *lms_local;
  ulong local_10;
  
  if (((ulong)(lms->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((lms->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(lms->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_10 >> 3),6);
  size_in = out.shared_alloc_.direct_ptr._4_4_ * 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Write<double>::Write((Write<double> *)local_58,size_in,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Write<double>::Write((Write<double> *)local_b0,(Write<double> *)local_58);
  Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,lms);
  parallel_for<Omega_h::delinearize_metrics_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_b0,"delinearize_metrics");
  Write<double>::Write(&local_c0,(Write<signed_char> *)local_58);
  Read<double>::Read((Read<double> *)this,&local_c0);
  Write<double>::~Write(&local_c0);
  delinearize_metrics_dim<3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_b0);
  Write<double>::~Write((Write<double> *)local_58);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals delinearize_metrics_dim(Reals lms) {
  auto n = divide_no_remainder(lms.size(), symm_ncomps(dim));
  auto out = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_symm(out, i, delinearize_metric(get_symm<dim>(lms, i)));
  };
  parallel_for(n, f, "delinearize_metrics");
  return out;
}